

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O2

void CompareSilfTables(int *ec,TestCase *ptcase,GrIStream *grstrmB,GrIStream *grstrmT,
                      int *pchwMaxGlyphID)

{
  int *piVar1;
  TestCase *pTVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  string *this;
  GrIStream *pGVar13;
  ulong uVar14;
  uint *puVar15;
  bool bVar16;
  allocator local_ff9;
  int *local_ff8;
  int local_fec;
  uint local_fe8;
  char local_fe1;
  TestCase *local_fe0;
  uint *local_fd8;
  ulong local_fd0;
  long lSubTableStartT;
  long lSubTableStartB;
  int local_fb8;
  uint local_fb4;
  long local_fb0;
  uint *local_fa8;
  uint *local_fa0;
  string local_f98;
  string local_f78;
  string local_f58;
  string local_f38;
  string local_f18;
  string local_ef8;
  string local_ed8;
  string local_eb8;
  string local_e98;
  string local_e78;
  string local_e58;
  string local_e38;
  string local_e18;
  string local_df8;
  string local_dd8;
  string local_db8;
  string local_d98;
  string local_d78;
  string local_d58;
  string local_d38;
  string local_d18;
  string local_cf8;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  int rgnPassOffsets [128];
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  int nSubTableOffsetsB [256];
  int nSubTableOffsetsT [256];
  
  local_ff8 = ec;
  local_fd8 = (uint *)pchwMaxGlyphID;
  uVar4 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
  local_fb4 = 0x10000;
  if (0x10000 < (int)uVar4) {
    local_fb4 = uVar4;
  }
  local_fec = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
  iVar6 = 0x10000;
  if (0x10000 < local_fec) {
    iVar6 = local_fec;
  }
  if (0x50000 < local_fec) {
    std::__cxx11::string::string
              ((string *)&local_b38,"ERROR: Unknown Silf table version in test font",
               (allocator *)nSubTableOffsetsB);
    OutputError(local_ff8,ptcase,&local_b38,-1);
    this = &local_b38;
LAB_00104cf5:
    std::__cxx11::string::~string((string *)this);
    return;
  }
  if (0x2ffff < (int)uVar4) {
    (*grstrmB->_vptr_GrIStream[4])(grstrmB);
  }
  local_fe8 = uVar4;
  local_fb8 = iVar6;
  if (0x2ffff < local_fec) {
    (*grstrmT->_vptr_GrIStream[4])(grstrmT);
  }
  uVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  uVar5 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)uVar5 != 1) {
    if ((uVar5 & 0xffff) == 0) {
      std::__cxx11::string::string
                ((string *)&local_b58,"ERROR: Silf table has no subtable",
                 (allocator *)nSubTableOffsetsB);
      OutputError(local_ff8,ptcase,&local_b58,-1);
      this = &local_b58;
      goto LAB_00104cf5;
    }
    std::__cxx11::string::string
              ((string *)&local_b78,"ERROR: Silf table has greater than 1 subtable",
               (allocator *)nSubTableOffsetsB);
    OutputError(local_ff8,ptcase,&local_b78,-1);
    std::__cxx11::string::~string((string *)&local_b78);
  }
  if (0x1ffff < (int)local_fe8) {
    (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  }
  local_fe0 = ptcase;
  if (0x1ffff < local_fec) {
    (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  }
  for (uVar14 = 0; pTVar2 = local_fe0, (uVar4 & 0xffff) != uVar14; uVar14 = uVar14 + 1) {
    iVar6 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
    nSubTableOffsetsB[uVar14] = iVar6;
  }
  for (uVar14 = 0; (uVar5 & 0xffff) != uVar14; uVar14 = uVar14 + 1) {
    iVar6 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
    nSubTableOffsetsT[uVar14] = iVar6;
  }
  (*grstrmB->_vptr_GrIStream[7])(grstrmB,(long)nSubTableOffsetsB[0]);
  (*grstrmT->_vptr_GrIStream[7])(grstrmT,(long)nSubTableOffsetsT[0]);
  (*grstrmB->_vptr_GrIStream[6])(grstrmB,&lSubTableStartB);
  (*grstrmT->_vptr_GrIStream[6])(grstrmT,&lSubTableStartT);
  uVar4 = local_fe8;
  if (0x2ffff < (int)local_fe8) {
    (*grstrmB->_vptr_GrIStream[4])(grstrmB);
  }
  if (0x2ffff < local_fec) {
    (*grstrmT->_vptr_GrIStream[4])(grstrmT);
  }
  puVar11 = (uint *)0xffffffffffffffff;
  local_fb0 = -1;
  puVar15 = puVar11;
  if (0x2ffff < (int)uVar4) {
    uVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
    local_fb0 = (ulong)(uVar4 & 0xffff) + CONCAT44(lSubTableStartB._4_4_,(int)lSubTableStartB);
    uVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
    puVar15 = (uint *)((ulong)(uVar4 & 0xffff) +
                      CONCAT44(lSubTableStartB._4_4_,(int)lSubTableStartB));
  }
  local_fa0 = puVar11;
  if (0x2ffff < local_fec) {
    uVar4 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
    puVar11 = (uint *)((ulong)(uVar4 & 0xffff) +
                      CONCAT44(lSubTableStartT._4_4_,(int)lSubTableStartT));
    uVar4 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
    local_fa0 = (uint *)((ulong)(uVar4 & 0xffff) +
                        CONCAT44(lSubTableStartT._4_4_,(int)lSubTableStartT));
  }
  uVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  puVar3 = local_fd8;
  *local_fd8 = uVar4 & 0xffff;
  uVar4 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if (*puVar3 != (uVar4 & 0xffff)) {
    std::__cxx11::string::string
              ((string *)&local_b98,"ERROR: Silf table - maxiumum glyph ID",
               (allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_b98,-1);
    std::__cxx11::string::~string((string *)&local_b98);
    *local_fd8 = 0xffffffff;
  }
  local_fd8 = puVar11;
  iVar6 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_bb8,"ERROR: Silf table - extra ascent",(allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_bb8,-1);
    std::__cxx11::string::~string((string *)&local_bb8);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_bd8,"ERROR: Silf table - extra descent",(allocator *)rgnPassOffsets)
    ;
    OutputError(local_ff8,pTVar2,&local_bd8,-1);
    std::__cxx11::string::~string((string *)&local_bd8);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_bf8,"ERROR: Silf table - number of passes",
               (allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_bf8,-1);
    std::__cxx11::string::~string((string *)&local_bf8);
  }
  local_fd0 = CONCAT71(local_fd0._1_7_,(char)iVar6);
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_c18,"ERROR: Silf table - first substitution pass",
               (allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_c18,-1);
    std::__cxx11::string::~string((string *)&local_c18);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_c38,"ERROR: Silf table - first positioning pass",
               (allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_c38,-1);
    std::__cxx11::string::~string((string *)&local_c38);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_c58,"ERROR: Silf table - first justification pass",
               (allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_c58,-1);
    std::__cxx11::string::~string((string *)&local_c58);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_c78,"ERROR: Silf table - first reordered pass",
               (allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_c78,-1);
    std::__cxx11::string::~string((string *)&local_c78);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_c98,"ERROR: Silf table - flags",(allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_c98,-1);
    std::__cxx11::string::~string((string *)&local_c98);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_cb8,"ERROR: Silf table - pre LB context",(allocator *)rgnPassOffsets
              );
    OutputError(local_ff8,pTVar2,&local_cb8,-1);
    std::__cxx11::string::~string((string *)&local_cb8);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_cd8,"ERROR: Silf table - post LB context",
               (allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_cd8,-1);
    std::__cxx11::string::~string((string *)&local_cd8);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_cf8,"ERROR: Silf table - actual-for-pseudo attr",
               (allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_cf8,-1);
    std::__cxx11::string::~string((string *)&local_cf8);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_d18,"ERROR: Silf table - breakweight attr",
               (allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_d18,-1);
    std::__cxx11::string::~string((string *)&local_d18);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  uVar4 = local_fe8;
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_d38,"ERROR: Silf table - directionality attr",
               (allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_d38,-1);
    std::__cxx11::string::~string((string *)&local_d38);
  }
  local_fe1 = 0x1ffff < (int)uVar4 && 0x1ffff < local_fec;
  local_fa8 = puVar15;
  if (0x1ffff < (int)uVar4 && 0x1ffff < local_fec) {
    iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
    iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
    if (uVar4 < 0x40000) {
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      (*grstrmT->_vptr_GrIStream[1])(grstrmT);
    }
    else {
      if ((char)iVar6 != (char)iVar7) {
        std::__cxx11::string::string
                  ((string *)&local_d58,"ERROR: Silf table - mirroring attrs",
                   (allocator *)rgnPassOffsets);
        OutputError(local_ff8,pTVar2,&local_d58,-1);
        std::__cxx11::string::~string((string *)&local_d58);
      }
      iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      if ((char)iVar6 != (char)iVar7) {
        std::__cxx11::string::string
                  ((string *)&local_d78,"ERROR: Silf table - skip-passes attr",
                   (allocator *)rgnPassOffsets);
        OutputError(local_ff8,pTVar2,&local_d78,-1);
        std::__cxx11::string::~string((string *)&local_d78);
      }
    }
    uVar4 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
    iVar6 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
    if ((char)uVar4 != (char)iVar6) {
      std::__cxx11::string::string
                ((string *)&local_d98,"ERROR: Silf table - justification levels",
                 (allocator *)rgnPassOffsets);
      OutputError(local_ff8,pTVar2,&local_d98,-1);
      this = &local_d98;
      goto LAB_00104cf5;
    }
    for (uVar5 = 0; (uVar4 & 0xff) != uVar5; uVar5 = uVar5 + 1) {
      iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      if ((char)iVar6 != (char)iVar7) {
        std::__cxx11::string::string
                  ((string *)&local_858,"ERROR: Silf table - stretch",(allocator *)rgnPassOffsets);
        OutputError(local_ff8,local_fe0,&local_858,uVar5);
        std::__cxx11::string::~string((string *)&local_858);
      }
      iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      if ((char)iVar6 != (char)iVar7) {
        std::__cxx11::string::string
                  ((string *)&local_878,"ERROR: Silf table - shrink",(allocator *)rgnPassOffsets);
        OutputError(local_ff8,local_fe0,&local_878,uVar5);
        std::__cxx11::string::~string((string *)&local_878);
      }
      iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      if ((char)iVar6 != (char)iVar7) {
        std::__cxx11::string::string
                  ((string *)&local_898,"ERROR: Silf table - step",(allocator *)rgnPassOffsets);
        OutputError(local_ff8,local_fe0,&local_898,uVar5);
        std::__cxx11::string::~string((string *)&local_898);
      }
      iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      if ((char)iVar6 != (char)iVar7) {
        std::__cxx11::string::string
                  ((string *)&local_8b8,"ERROR: Silf table - weight",(allocator *)rgnPassOffsets);
        OutputError(local_ff8,local_fe0,&local_8b8,uVar5);
        std::__cxx11::string::~string((string *)&local_8b8);
      }
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      (*grstrmT->_vptr_GrIStream[1])(grstrmT);
    }
  }
  else if ((int)uVar4 < 0x20000) {
    if (0x1ffff < local_fec) {
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      uVar4 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      pTVar2 = local_fe0;
      if ((char)uVar4 != '\0') {
        std::__cxx11::string::string
                  ((string *)&local_dd8,
                   "ERROR: Silf table - justification data found but not expected",
                   (allocator *)rgnPassOffsets);
        OutputError(local_ff8,pTVar2,&local_dd8,-1);
        std::__cxx11::string::~string((string *)&local_dd8);
      }
      uVar4 = uVar4 & 0xff;
      while (bVar16 = uVar4 != 0, uVar4 = uVar4 - 1, bVar16) {
        (*grstrmB->_vptr_GrIStream[5])(grstrmB,rgnPassOffsets,8);
      }
    }
  }
  else {
    (*grstrmB->_vptr_GrIStream[1])(grstrmB);
    (*grstrmB->_vptr_GrIStream[1])(grstrmB);
    uVar4 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
    if ((char)uVar4 != '\0') {
      std::__cxx11::string::string
                ((string *)&local_db8,"ERROR: Silf table - missing justification data",
                 (allocator *)rgnPassOffsets);
      OutputError(local_ff8,pTVar2,&local_db8,-1);
      std::__cxx11::string::~string((string *)&local_db8);
    }
    uVar4 = uVar4 & 0xff;
    while (bVar16 = uVar4 != 0, uVar4 = uVar4 - 1, bVar16) {
      (*grstrmB->_vptr_GrIStream[5])(grstrmB,rgnPassOffsets,8);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  pTVar2 = local_fe0;
  piVar1 = local_ff8;
  if ((short)iVar6 != (short)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_df8,"ERROR: Silf table - number of components",
               (allocator *)rgnPassOffsets);
    OutputError(piVar1,pTVar2,&local_df8,-1);
    std::__cxx11::string::~string((string *)&local_df8);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_e18,"ERROR: Silf table - number of user-defined slot attributes",
               (allocator *)rgnPassOffsets);
    OutputError(piVar1,pTVar2,&local_e18,-1);
    std::__cxx11::string::~string((string *)&local_e18);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_e38,"ERROR: Silf table - max number of ligature components",
               (allocator *)rgnPassOffsets);
    OutputError(piVar1,pTVar2,&local_e38,-1);
    std::__cxx11::string::~string((string *)&local_e38);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_e58,"ERROR: Silf table - supported directions",
               (allocator *)rgnPassOffsets);
    OutputError(piVar1,pTVar2,&local_e58,-1);
    std::__cxx11::string::~string((string *)&local_e58);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((0x40000 < (int)local_fe8) && ((char)iVar6 != (char)iVar7)) {
    std::__cxx11::string::string
              ((string *)&local_e78,"ERROR: Silf table - collision attributes",
               (allocator *)rgnPassOffsets);
    OutputError(piVar1,pTVar2,&local_e78,-1);
    std::__cxx11::string::~string((string *)&local_e78);
  }
  (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  pGVar13 = grstrmT;
  if (local_fe1 == '\0') {
    if ((int)local_fe8 < 0x20000) {
      bVar9 = (byte)local_fd0;
      if (local_fec < 0x20000) goto LAB_00104d7d;
      (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      iVar6 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      if ((char)iVar6 != '\0') {
        std::__cxx11::string::string
                  ((string *)&local_ed8,
                   "ERROR: Silf table - critical features found but not expected",
                   (allocator *)rgnPassOffsets);
        OutputError(piVar1,pTVar2,&local_ed8,-1);
        std::__cxx11::string::~string((string *)&local_ed8);
      }
    }
    else {
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      bVar9 = (byte)local_fd0;
      pGVar13 = grstrmB;
      if ((char)iVar6 != '\0') {
        std::__cxx11::string::string
                  ((string *)&local_eb8,"ERROR: Silf table - critical features not equal to zero",
                   (allocator *)rgnPassOffsets);
        OutputError(piVar1,pTVar2,&local_eb8,-1);
        std::__cxx11::string::~string((string *)&local_eb8);
      }
    }
  }
  else {
    (*grstrmB->_vptr_GrIStream[1])(grstrmB);
    (*grstrmT->_vptr_GrIStream[1])(grstrmT);
    iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
    iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
    bVar9 = (byte)local_fd0;
    if ((char)iVar6 != (char)iVar7) {
      std::__cxx11::string::string
                ((string *)&local_e98,"ERROR: Silf table - critical features",
                 (allocator *)rgnPassOffsets);
      OutputError(piVar1,pTVar2,&local_e98,-1);
      std::__cxx11::string::~string((string *)&local_e98);
    }
    (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  }
  (*pGVar13->_vptr_GrIStream[1])();
  local_fd0._0_1_ = bVar9;
LAB_00104d7d:
  local_fd0 = (ulong)(byte)local_fd0;
  uVar4 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  uVar12 = uVar4 & 0xff;
  uVar5 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  uVar10 = uVar5 & 0xff;
  if ((char)uVar4 != (char)uVar5) {
    std::__cxx11::string::string
              ((string *)&local_ef8,"ERROR: Silf table - rendering behaviors",
               (allocator *)rgnPassOffsets);
    OutputError(local_ff8,pTVar2,&local_ef8,-1);
    std::__cxx11::string::~string((string *)&local_ef8);
  }
  while (piVar1 = local_ff8, bVar16 = uVar12 != 0, uVar12 = uVar12 - 1, bVar16) {
    (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  }
  while (bVar16 = uVar10 != 0, uVar10 = uVar10 - 1, bVar16) {
    (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  uVar4 = local_fe8;
  if ((short)iVar6 != (short)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_f18,"ERROR: Silf table - linebreak glyph ID",
               (allocator *)rgnPassOffsets);
    OutputError(piVar1,pTVar2,&local_f18,-1);
    std::__cxx11::string::~string((string *)&local_f18);
  }
  if (0x2ffff < (int)uVar4) {
    (*grstrmB->_vptr_GrIStream[7])(grstrmB,local_fb0);
  }
  if (0x2ffff < local_fec) {
    (*grstrmT->_vptr_GrIStream[7])(grstrmT,local_fd8);
  }
  iVar6 = (int)local_fd0;
  local_fd8 = (uint *)CONCAT44(local_fd8._4_4_,(int)CONCAT71((int7)(local_fd0 >> 8),1));
  for (uVar14 = 0; iVar6 + 1 != uVar14; uVar14 = uVar14 + 1) {
    iVar7 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
    rgnPassOffsets[uVar14] = iVar7;
    iVar8 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
    if (iVar7 != iVar8) {
      std::__cxx11::string::string
                ((string *)&local_8d8,"ERROR: Silf table - pass offsets",&local_ff9);
      OutputError(local_ff8,local_fe0,&local_8d8,(int)uVar14);
      std::__cxx11::string::~string((string *)&local_8d8);
      local_fd8 = (uint *)((ulong)local_fd8 & 0xffffffff00000000);
    }
  }
  if (0x2ffff < (int)local_fe8) {
    (*grstrmB->_vptr_GrIStream[7])(grstrmB,local_fa8);
  }
  pTVar2 = local_fe0;
  if (0x2ffff < local_fec) {
    (*grstrmT->_vptr_GrIStream[7])(grstrmT,local_fa0);
  }
  uVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar6 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)uVar4 != (short)iVar6) {
    std::__cxx11::string::string
              ((string *)&local_f38,"ERROR: Silf table - pseudo search count",&local_ff9);
    OutputError(local_ff8,pTVar2,&local_f38,-1);
    std::__cxx11::string::~string((string *)&local_f38);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_f58,"ERROR: Silf table - pseudo search increment",&local_ff9);
    OutputError(local_ff8,pTVar2,&local_f58,-1);
    std::__cxx11::string::~string((string *)&local_f58);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_f78,"ERROR: Silf table - pseudo search loop",&local_ff9);
    OutputError(local_ff8,pTVar2,&local_f78,-1);
    std::__cxx11::string::~string((string *)&local_f78);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    std::__cxx11::string::string
              ((string *)&local_f98,"ERROR: Silf table - pseudo search start",&local_ff9);
    OutputError(local_ff8,pTVar2,&local_f98,-1);
    std::__cxx11::string::~string((string *)&local_f98);
  }
  for (uVar5 = 0; uVar10 = local_fb4, pTVar2 = local_fe0, piVar1 = local_ff8,
      (uVar4 & 0xffff) != uVar5; uVar5 = uVar5 + 1) {
    if ((int)local_fe8 < 0x10001) {
      uVar10 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
      uVar10 = uVar10 & 0xffff;
    }
    else {
      uVar10 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
    }
    if (local_fec < 0x10001) {
      uVar12 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
      uVar12 = uVar12 & 0xffff;
    }
    else {
      uVar12 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
    }
    if (uVar10 != uVar12) {
      std::__cxx11::string::string
                ((string *)&local_8f8,"ERROR: Silf table - unicode for pseudo",&local_ff9);
      OutputError(local_ff8,local_fe0,&local_8f8,uVar5);
      std::__cxx11::string::~string((string *)&local_8f8);
    }
    iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
    iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
    if ((short)iVar6 != (short)iVar7) {
      std::__cxx11::string::string
                ((string *)&local_918,"ERROR: Silf table = pseudo value",&local_ff9);
      OutputError(local_ff8,local_fe0,&local_918,uVar5);
      std::__cxx11::string::~string((string *)&local_918);
    }
  }
  CompareClassMaps(local_ff8,local_fe0,grstrmB,grstrmT,local_fb4);
  if (((ulong)local_fd8 & 1) != 0) {
    ComparePasses(piVar1,pTVar2,grstrmB,grstrmT,uVar10,local_fb8,(int)local_fd0,(int)lSubTableStartB
                  ,(int)lSubTableStartT,rgnPassOffsets);
  }
  return;
}

Assistant:

void CompareSilfTables(int & ec, TestCase * ptcase, GrIStream & grstrmB, GrIStream & grstrmT,
	int * pchwMaxGlyphID)
{
	int fxdSilfVersionB = ReadVersion(grstrmB);
	int fxdSilfVersionT = ReadVersion(grstrmT);

	Assert(fxdSilfVersionB <= kSilfVersion);
	if (fxdSilfVersionT > kSilfVersion)
	{
		OutputError(ec, ptcase, "ERROR: Unknown Silf table version in test font");
		return;
	}

	if (fxdSilfVersionB >= 0x00030000)
		 // compiler version
		grstrmB.ReadIntFromFont();
	if (fxdSilfVersionT >= 0x00030000)
		grstrmT.ReadIntFromFont();

	//	number of tables
	unsigned short cSubTablesB = grstrmB.ReadUShortFromFont();
	Assert(cSubTablesB == 1);	// for now
	Assert(cSubTablesB <= kMaxSubTablesInFont);
	unsigned short cSubTablesT = grstrmT.ReadUShortFromFont();
	if (cSubTablesT < 1)
	{
		OutputError(ec, ptcase, "ERROR: Silf table has no subtable");
		return;
	}
	if (cSubTablesT > 1)
		OutputError(ec, ptcase, "ERROR: Silf table has greater than 1 subtable");

    if (fxdSilfVersionB >= 0x00020000)
		// reserved
		grstrmB.ReadShortFromFont();
	if (fxdSilfVersionT >= 0x00020000)
		grstrmT.ReadShortFromFont();

	//	subtable offsets
	int nSubTableOffsetsB[kMaxSubTablesInFont];
	int nSubTableOffsetsT[kMaxSubTablesInFont];
	int i;
	for (i = 0; i < cSubTablesB; i++)
		nSubTableOffsetsB[i] = grstrmB.ReadIntFromFont();
	for (i = 0; i < cSubTablesT; i++)
		nSubTableOffsetsT[i] = grstrmT.ReadIntFromFont();
	grstrmB.SetPositionInFont(nSubTableOffsetsB[0]);
	grstrmT.SetPositionInFont(nSubTableOffsetsT[0]);

	//	Now we are at the beginning of the desired sub-table.

	//	Get the position of the start of the table.
	long lSubTableStartB, lSubTableStartT;
	grstrmB.GetPositionInFont(&lSubTableStartB);
	grstrmT.GetPositionInFont(&lSubTableStartT);

	//	rule version
	uint32_t fxdRuleVersionB = (fxdSilfVersionB >= 0x00030000) ? ReadVersion(grstrmB) : fxdSilfVersionB;
	uint32_t fxdRuleVersionT = (fxdSilfVersionT >= 0x00030000) ? ReadVersion(grstrmT) : fxdSilfVersionT;

	long lPassBlockPosB = -1;
	long lPseudosPosB = -1;
	if (fxdSilfVersionB >= 0x00030000)
	{
		lPassBlockPosB = grstrmB.ReadUShortFromFont() + lSubTableStartB;
		lPseudosPosB = grstrmB.ReadUShortFromFont() + lSubTableStartB;
	}
	long lPassBlockPosT = -1;
	long lPseudosPosT = -1;
	if (fxdSilfVersionT >= 0x00030000)
	{
		lPassBlockPosT = grstrmT.ReadUShortFromFont() + lSubTableStartT;
		lPseudosPosT = grstrmT.ReadUShortFromFont() + lSubTableStartT;
	}

	//	maximum glyph ID
	*pchwMaxGlyphID = grstrmB.ReadUShortFromFont();
	if (grstrmT.ReadUShortFromFont() != *pchwMaxGlyphID)
	{
		OutputError(ec, ptcase, "ERROR: Silf table - maxiumum glyph ID");
		*pchwMaxGlyphID = -1;
	}

	//	extra ascent
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - extra ascent");
	// extra descent
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - extra descent");

	//	number of passes
	gr::byte cPasses = grstrmB.ReadByteFromFont();
	if (cPasses != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - number of passes");
	//	index of first substitution pass
	gr::byte ipassSub1 = grstrmB.ReadByteFromFont();
	if (ipassSub1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first substitution pass");
	//	index of first positioning pass
	gr::byte ipassPos1 = grstrmB.ReadByteFromFont();
	if (ipassPos1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first positioning pass");
	//	index of first justification pass
	gr::byte ipassJust1 = grstrmB.ReadByteFromFont();
	if (ipassJust1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first justification pass");
	//	index of first reordered pass, or 0xFF if no reordering
	gr::byte ipassReordered1 = grstrmB.ReadByteFromFont();
	if (ipassReordered1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first reordered pass");

	gr::byte bT, bB;
	//	flags
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - flags");

	//	range of possible cross-line-boundary contextualization
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - pre LB context");
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - post LB context");

	//	actual glyph ID for pseudo-glyph (ID of bogus attribute)
	//long posB; grstrmB.GetPositionInFont(&posB); - debuggers
	//WriteToLog("benchmark position = ", posB, "; ");
	//long posT; grstrmT.GetPositionInFont(&posT);
	//WriteToLog("test font position = ", posT, "; ");
	//gr::byte tempB = grstrmB.ReadByteFromFont();
	//WriteToLog("next byte B = ", tempB, "; ");
	//gr::byte tempT = grstrmT.ReadByteFromFont();
	//WriteToLog("next byte T = ", tempT, "\n");
	//if (tempB != tempT)
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - actual-for-pseudo attr");
	//	breakweight
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - breakweight attr");
	//	directionality
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - directionality attr");

	if (fxdSilfVersionB >= 0x00020000 && fxdSilfVersionT >= 0x00020000)
	{
		if (fxdSilfVersionB >= 0x00040000) {
			if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
				OutputError(ec, ptcase, "ERROR: Silf table - mirroring attrs");
			if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
				OutputError(ec, ptcase, "ERROR: Silf table - skip-passes attr");
		}
		else
		{
			// reserved
			grstrmB.ReadByteFromFont();
			grstrmT.ReadByteFromFont();

			grstrmB.ReadByteFromFont();
			grstrmT.ReadByteFromFont();
		}		

		//	justification levels
		int cJLevels = grstrmB.ReadByteFromFont();
		if (cJLevels != grstrmT.ReadByteFromFont())
		{
			OutputError(ec, ptcase, "ERROR: Silf table - justification levels");
			return;
		}
		for (int i = 0; i < cJLevels; i++)
		{
			//	justification glyph attribute IDs
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - stretch", i);
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - shrink", i);
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - step", i);
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - weight", i);
			grstrmB.ReadByteFromFont(); // runto
			grstrmT.ReadByteFromFont();
			// reserved
			grstrmB.ReadByteFromFont();
			grstrmB.ReadByteFromFont();
			grstrmB.ReadByteFromFont();

			grstrmT.ReadByteFromFont();
			grstrmT.ReadByteFromFont();
			grstrmT.ReadByteFromFont();
		}
	}
	else if (fxdSilfVersionB >= 0x00020000)
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmB.ReadByteFromFont();
		//	justification levels
		int cJLevels = grstrmB.ReadByteFromFont();
		if (cJLevels > 0)
			OutputError(ec, ptcase, "ERROR: Silf table - missing justification data");
		gr::byte rgb[8];
		for (int i = 0; i < cJLevels; i++)
			grstrmB.ReadBlockFromFont(rgb, 8);
	}
	else if (fxdSilfVersionT >= 0x00020000)
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmB.ReadByteFromFont();
		//	justification levels
		int cJLevels = grstrmB.ReadByteFromFont();
		if (cJLevels > 0)
			OutputError(ec, ptcase, "ERROR: Silf table - justification data found but not expected");
		gr::byte rgb[8];
		for (int i = 0; i < cJLevels; i++)
			grstrmB.ReadBlockFromFont(rgb, 8);
	}

	//	number of component attributes
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - number of components");

	//	number of user-defined slot attributes
	if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - number of user-defined slot attributes");

	//	max number of ligature components per glyph
	if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - max number of ligature components");

	//	directions supported
	if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - supported directions");

	if (fxdSilfVersionB >= 0x00040001)
	{
		if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
			OutputError(ec, ptcase, "ERROR: Silf table - collision attributes");
	}
	else
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmT.ReadByteFromFont();
	}

	//	reserved
	grstrmB.ReadByteFromFont();
	grstrmB.ReadByteFromFont();
	grstrmT.ReadByteFromFont();
	grstrmT.ReadByteFromFont();

	//	critical features
	if (fxdSilfVersionB >= 0x00020000 && fxdSilfVersionT >= 0x00020000)
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmT.ReadByteFromFont();
		// critical features
		if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
			OutputError(ec, ptcase, "ERROR: Silf table - critical features");
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmT.ReadByteFromFont();
	}
	else if (fxdSilfVersionB >= 0x00020000)
	{
		grstrmB.ReadByteFromFont();
		if (grstrmB.ReadByteFromFont() != 0)
			OutputError(ec, ptcase, "ERROR: Silf table - critical features not equal to zero");
		grstrmB.ReadByteFromFont();
	}
	else if (fxdSilfVersionT >= 0x00020000)
	{
		grstrmT.ReadByteFromFont();
		if (grstrmT.ReadByteFromFont() != 0)
			OutputError(ec, ptcase, "ERROR: Silf table - critical features found but not expected");
		grstrmT.ReadByteFromFont();
	}

	//	rendering behaviors
	int cBehaviorsB = grstrmB.ReadByteFromFont();
	int cBehaviorsT = grstrmT.ReadByteFromFont();
	if (cBehaviorsB != cBehaviorsT)
		OutputError(ec, ptcase, "ERROR: Silf table - rendering behaviors");
	for (i = 0; i < cBehaviorsB; i++)
		grstrmB.ReadUShortFromFont();
	for (i = 0; i < cBehaviorsT; i++)
		grstrmT.ReadUShortFromFont();

	//	linebreak glyph ID
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - linebreak glyph ID");

	//	Jump to the beginning of the pass offset block, if we have this information.
	if (fxdSilfVersionB >= 0x00030000)
		grstrmB.SetPositionInFont(lPassBlockPosB);
	else
		//	Otherwise assume that's where we are!
		Assert(lPassBlockPosB == -1);

	if (fxdSilfVersionT >= 0x00030000)
		grstrmT.SetPositionInFont(lPassBlockPosT);
	else
		Assert(lPassBlockPosT == -1);

	//	offsets to passes, relative to the start of this subtable;
	//	note that we read (cPasses + 1) of these
	int rgnPassOffsets[kMaxPasses];
	bool fPassesOk = true;
	for (i = 0; i <= cPasses; i++)
	{
		rgnPassOffsets[i] = grstrmB.ReadIntFromFont();
		if (rgnPassOffsets[i] != grstrmT.ReadIntFromFont())
		{
			OutputError(ec, ptcase, "ERROR: Silf table - pass offsets", i);
			fPassesOk = false;
		}
	}

	//	Jump to the beginning of the pseudo-glyph info block, if we have this information.
	if (fxdSilfVersionB >= 0x00030000)
		grstrmB.SetPositionInFont(lPseudosPosB);
	else
		//	Otherwise assume that's where we are!
		Assert(lPseudosPosB == -1);

	if (fxdSilfVersionT >= 0x00030000)
		grstrmT.SetPositionInFont(lPseudosPosT);
	else
		Assert(lPseudosPosT == -1);

	//	number of pseudo-glyphs and search constants
	int cpsd = grstrmB.ReadUShortFromFont();
	if (cpsd != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search count");
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search increment");
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search loop");
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search start");

	//	unicode-to-pseudo map
	for (i = 0; i < cpsd; i++)
	{
		int unicodeB, unicodeT;
		if (fxdSilfVersionB <= 0x00010000)
			unicodeB = grstrmB.ReadUShortFromFont();
		else
			unicodeB = grstrmB.ReadIntFromFont();
		if (fxdSilfVersionT <= 0x00010000)
			unicodeT = grstrmT.ReadUShortFromFont();
		else
			unicodeT = grstrmT.ReadIntFromFont();
		if (unicodeB != unicodeT)
			OutputError(ec, ptcase, "ERROR: Silf table - unicode for pseudo", i);

		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: Silf table = pseudo value", i);
	}

	CompareClassMaps(ec, ptcase, grstrmB, grstrmT, fxdSilfVersionB);

	if (fPassesOk)
		ComparePasses(ec, ptcase, grstrmB, grstrmT,
			fxdSilfVersionB, fxdSilfVersionT, cPasses,
			lSubTableStartB, lSubTableStartT, rgnPassOffsets);
}